

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5UnicodeTokenize(Fts5Tokenizer *pTokenizer,void *pCtx,int iUnused,char *pText,int nText,
                       _func_int_void_ptr_int_char_ptr_int_int_int *xToken)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  byte bVar5;
  int iVar6;
  uint *puVar7;
  byte *pbVar8;
  byte *pbVar9;
  byte *pbVar10;
  uint *local_68;
  int local_5c;
  ulong local_58;
  int local_50;
  uint *local_48;
  
  pbVar9 = (byte *)(pText + nText);
  local_68 = *(uint **)(pTokenizer + 0x80);
  local_58 = (ulong)*(int *)(pTokenizer + 0x88);
  local_48 = (uint *)((long)local_68 + (local_58 - 6));
  iVar2 = 0;
  pbVar10 = (byte *)pText;
  do {
    if (iVar2 != 0) {
      iVar6 = 0;
      if (iVar2 != 0x65) {
        iVar6 = iVar2;
      }
      return iVar6;
    }
    while( true ) {
      while( true ) {
        if (pbVar9 <= pbVar10) {
          return 0;
        }
        bVar1 = *pbVar10;
        local_5c = (int)pbVar10;
        local_50 = (int)pText;
        puVar7 = local_68;
        if (-1 < (long)(char)bVar1) break;
        uVar4 = (uint)bVar1;
        pbVar10 = pbVar10 + 1;
        if (0xbf < bVar1) {
          uVar3 = (uint)""[bVar1 - 0xc0];
          for (; (pbVar10 != pbVar9 && ((*pbVar10 & 0xffffffc0) == 0x80)); pbVar10 = pbVar10 + 1) {
            uVar3 = uVar3 << 6 | *pbVar10 & 0x3f;
          }
          uVar4 = uVar3;
          if ((uVar3 & 0xfffff800) == 0xd800) {
            uVar4 = 0xfffd;
          }
          if (uVar3 < 0x80) {
            uVar4 = 0xfffd;
          }
          if ((uVar3 & 0xfffffffe) == 0xfffe) {
            uVar4 = 0xfffd;
          }
        }
        iVar2 = fts5UnicodeIsAlnum((Unicode61Tokenizer *)pTokenizer,uVar4);
        if (iVar2 != 0) {
          local_5c = local_5c - local_50;
          goto LAB_0019aa6b;
        }
      }
      if (pTokenizer[(char)bVar1] != (Fts5Tokenizer)0x0) break;
      pbVar10 = pbVar10 + 1;
    }
    local_5c = local_5c - local_50;
    pbVar8 = pbVar10;
    do {
      bVar5 = bVar1 + 0x20;
      if (0x19 < (byte)(bVar1 + 0xbf)) {
        bVar5 = bVar1;
      }
      *(byte *)puVar7 = bVar5;
      puVar7 = (uint *)((long)puVar7 + 1);
      pbVar8 = pbVar8 + 1;
      while( true ) {
        pbVar10 = pbVar8;
        if (pbVar9 <= pbVar8) goto LAB_0019a976;
        if (local_48 < puVar7) {
          iVar2 = (int)local_58;
          local_68 = (uint *)sqlite3_malloc64((long)iVar2 * 2);
          if (local_68 == (uint *)0x0) {
            return 7;
          }
          puVar7 = (uint *)(((long)puVar7 - (long)*(void **)(pTokenizer + 0x80)) + (long)local_68);
          memcpy(local_68,*(void **)(pTokenizer + 0x80),(long)iVar2);
          sqlite3_free(*(void **)(pTokenizer + 0x80));
          *(uint **)(pTokenizer + 0x80) = local_68;
          uVar4 = iVar2 * 2;
          local_58 = (ulong)uVar4;
          *(uint *)(pTokenizer + 0x88) = uVar4;
          local_48 = (uint *)((long)local_68 + (long)(int)uVar4 + -6);
        }
        bVar1 = *pbVar8;
        if (-1 < (long)(char)bVar1) break;
        uVar4 = (uint)bVar1;
        pbVar10 = pbVar8 + 1;
        if (0xbf < bVar1) {
          uVar3 = (uint)""[bVar1 - 0xc0];
          for (; (pbVar10 != pbVar9 && ((*pbVar10 & 0xffffffc0) == 0x80)); pbVar10 = pbVar10 + 1) {
            uVar3 = uVar3 << 6 | *pbVar10 & 0x3f;
          }
          uVar4 = uVar3;
          if ((uVar3 & 0xfffff800) == 0xd800) {
            uVar4 = 0xfffd;
          }
          if (uVar3 < 0x80) {
            uVar4 = 0xfffd;
          }
          if ((uVar3 & 0xfffffffe) == 0xfffe) {
            uVar4 = 0xfffd;
          }
        }
        iVar2 = fts5UnicodeIsAlnum((Unicode61Tokenizer *)pTokenizer,uVar4);
        if ((iVar2 == 0) && (iVar2 = sqlite3Fts5UnicodeIsdiacritic(uVar4), iVar2 == 0))
        goto LAB_0019a976;
LAB_0019aa6b:
        uVar4 = sqlite3Fts5UnicodeFold(uVar4,*(int *)(pTokenizer + 0x8c));
        pbVar8 = pbVar10;
        if (uVar4 != 0) {
          bVar1 = (byte)uVar4;
          if (uVar4 < 0x80) {
            *(byte *)puVar7 = bVar1;
            puVar7 = (uint *)((long)puVar7 + 1);
          }
          else if (uVar4 < 0x800) {
            *(byte *)puVar7 = (byte)(uVar4 >> 6) | 0xc0;
            *(byte *)((long)puVar7 + 1) = bVar1 & 0x3f | 0x80;
            puVar7 = (uint *)((long)puVar7 + 2);
          }
          else if (uVar4 < 0x10000) {
            *(byte *)puVar7 = (byte)(uVar4 >> 0xc) | 0xe0;
            *(byte *)((long)puVar7 + 1) = (byte)(uVar4 >> 6) & 0x3f | 0x80;
            *(byte *)((long)puVar7 + 2) = bVar1 & 0x3f | 0x80;
            puVar7 = (uint *)((long)puVar7 + 3);
          }
          else {
            *puVar7 = (uVar4 << 0x18 |
                      (uVar4 & 0x3fc0) << 10 | uVar4 >> 0x12 & 0xff | uVar4 >> 4 & 0xff00) &
                      (uint)DAT_001c4060 | (uint)DAT_001c4070;
            puVar7 = puVar7 + 1;
          }
        }
      }
    } while (pTokenizer[(char)bVar1] != (Fts5Tokenizer)0x0);
LAB_0019a976:
    iVar2 = (*xToken)(pCtx,0,(char *)local_68,(int)puVar7 - (int)local_68,local_5c,
                      (int)pbVar8 - local_50);
  } while( true );
}

Assistant:

static int fts5UnicodeTokenize(
  Fts5Tokenizer *pTokenizer,
  void *pCtx,
  int iUnused,
  const char *pText, int nText,
  int (*xToken)(void*, int, const char*, int nToken, int iStart, int iEnd)
){
  Unicode61Tokenizer *p = (Unicode61Tokenizer*)pTokenizer;
  int rc = SQLITE_OK;
  unsigned char *a = p->aTokenChar;

  unsigned char *zTerm = (unsigned char*)&pText[nText];
  unsigned char *zCsr = (unsigned char *)pText;

  /* Output buffer */
  char *aFold = p->aFold;
  int nFold = p->nFold;
  const char *pEnd = &aFold[nFold-6];

  UNUSED_PARAM(iUnused);

  /* Each iteration of this loop gobbles up a contiguous run of separators,
  ** then the next token.  */
  while( rc==SQLITE_OK ){
    u32 iCode;                    /* non-ASCII codepoint read from input */
    char *zOut = aFold;
    int is;
    int ie;

    /* Skip any separator characters. */
    while( 1 ){
      if( zCsr>=zTerm ) goto tokenize_done;
      if( *zCsr & 0x80 ) {
        /* A character outside of the ascii range. Skip past it if it is
        ** a separator character. Or break out of the loop if it is not. */
        is = zCsr - (unsigned char*)pText;
        READ_UTF8(zCsr, zTerm, iCode);
        if( fts5UnicodeIsAlnum(p, iCode) ){
          goto non_ascii_tokenchar;
        }
      }else{
        if( a[*zCsr] ){
          is = zCsr - (unsigned char*)pText;
          goto ascii_tokenchar;
        }
        zCsr++;
      }
    }

    /* Run through the tokenchars. Fold them into the output buffer along
    ** the way.  */
    while( zCsr<zTerm ){

      /* Grow the output buffer so that there is sufficient space to fit the
      ** largest possible utf-8 character.  */
      if( zOut>pEnd ){
        aFold = sqlite3_malloc64((sqlite3_int64)nFold*2);
        if( aFold==0 ){
          rc = SQLITE_NOMEM;
          goto tokenize_done;
        }
        zOut = &aFold[zOut - p->aFold];
        memcpy(aFold, p->aFold, nFold);
        sqlite3_free(p->aFold);
        p->aFold = aFold;
        p->nFold = nFold = nFold*2;
        pEnd = &aFold[nFold-6];
      }

      if( *zCsr & 0x80 ){
        /* An non-ascii-range character. Fold it into the output buffer if
        ** it is a token character, or break out of the loop if it is not. */
        READ_UTF8(zCsr, zTerm, iCode);
        if( fts5UnicodeIsAlnum(p,iCode)||sqlite3Fts5UnicodeIsdiacritic(iCode) ){
 non_ascii_tokenchar:
          iCode = sqlite3Fts5UnicodeFold(iCode, p->eRemoveDiacritic);
          if( iCode ) WRITE_UTF8(zOut, iCode);
        }else{
          break;
        }
      }else if( a[*zCsr]==0 ){
        /* An ascii-range separator character. End of token. */
        break; 
      }else{
 ascii_tokenchar:
        if( *zCsr>='A' && *zCsr<='Z' ){
          *zOut++ = *zCsr + 32;
        }else{
          *zOut++ = *zCsr;
        }
        zCsr++;
      }
      ie = zCsr - (unsigned char*)pText;
    }

    /* Invoke the token callback */
    rc = xToken(pCtx, 0, aFold, zOut-aFold, is, ie); 
  }
  
 tokenize_done:
  if( rc==SQLITE_DONE ) rc = SQLITE_OK;
  return rc;
}